

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O3

iterator anon_unknown.dwarf_155a02::TransformConfigure
                   (TransformAction action,
                   unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
                   *selector,size_t arity)

{
  undefined1 *puVar1;
  unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_> *puVar2;
  byte bVar3;
  char cVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  TransformSelector *pTVar7;
  runtime_error *prVar8;
  undefined **ppuVar9;
  _Link_type p_Var10;
  _Link_type __p;
  _Base_ptr p_Var11;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar12;
  _Rb_tree_color local_a0;
  TransformAction local_9c;
  string local_98;
  string local_78;
  undefined8 local_50;
  long *plStack_48;
  _Base_ptr local_40;
  unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_> *local_38;
  
  if ((anonymous_namespace)::Descriptors._64_8_ == 0) {
    __p = (_Link_type)selector;
    p_Var5 = (_Base_ptr)operator_new(0x30);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    p_Var5->_M_left = (_Base_ptr)0x0;
    p_Var5->_M_right = (_Base_ptr)0x0;
    *(undefined8 *)(p_Var5 + 1) = 0;
    p_Var5[1]._M_parent = (_Base_ptr)0x0;
    ppuVar9 = &PTR__TransformActionAppend_00a36fd8;
    *(undefined ***)p_Var5 = &PTR__TransformActionAppend_00a36fd8;
    p_Var5->_M_left = p_Var5 + 1;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    p_Var6[1]._M_color = _S_red;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    *(undefined4 *)&p_Var6[1]._M_right = 0x45505041;
    *(undefined2 *)((long)&p_Var6[1]._M_right + 4) = 0x444e;
    *(undefined1 *)((long)&p_Var6[1]._M_right + 6) = 0;
    p_Var6[1]._M_left = (_Base_ptr)&DAT_00000006;
    p_Var6[2]._M_parent = (_Base_ptr)0x1;
    p_Var6[2]._M_left = p_Var5;
    pVar12 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)__p);
    p_Var10 = (_Link_type)pVar12.second;
    if (p_Var10 == (_Link_type)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,__p);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar12.first,(_Base_ptr)p_Var10,p_Var6,(_Link_type)ppuVar9);
      __p = p_Var10;
    }
    p_Var5 = (_Base_ptr)operator_new(0x30);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    p_Var5->_M_left = (_Base_ptr)0x0;
    p_Var5->_M_right = (_Base_ptr)0x0;
    *(undefined8 *)(p_Var5 + 1) = 0;
    p_Var5[1]._M_parent = (_Base_ptr)0x0;
    ppuVar9 = &PTR__TransformActionPrepend_00a37040;
    *(undefined ***)p_Var5 = &PTR__TransformActionPrepend_00a37040;
    p_Var5->_M_left = p_Var5 + 1;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    p_Var6[1]._M_color = _S_black;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    *(undefined4 *)&p_Var6[1]._M_right = 0x50455250;
    *(undefined4 *)((long)&p_Var6[1]._M_right + 3) = 0x444e4550;
    *(undefined1 *)((long)&p_Var6[1]._M_right + 7) = 0;
    p_Var6[1]._M_left = (_Base_ptr)0x7;
    p_Var6[2]._M_parent = (_Base_ptr)0x1;
    p_Var6[2]._M_left = p_Var5;
    pVar12 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)__p);
    p_Var10 = (_Link_type)pVar12.second;
    if (p_Var10 == (_Link_type)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,__p);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar12.first,(_Base_ptr)p_Var10,p_Var6,(_Link_type)ppuVar9);
      __p = p_Var10;
    }
    p_Var5 = (_Base_ptr)operator_new(0x10);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformAction_00a37098;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    p_Var6[1]._M_color = 3;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    *(undefined4 *)&p_Var6[1]._M_right = 0x50554f54;
    *(undefined4 *)((long)&p_Var6[1]._M_right + 3) = 0x52455050;
    *(undefined1 *)((long)&p_Var6[1]._M_right + 7) = 0;
    p_Var6[1]._M_left = (_Base_ptr)0x7;
    p_Var6[2]._M_parent = (_Base_ptr)0x0;
    p_Var6[2]._M_left = p_Var5;
    pVar12 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)__p);
    p_Var10 = (_Link_type)pVar12.second;
    if (p_Var10 == (_Link_type)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,__p);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar12.first,(_Base_ptr)p_Var10,p_Var6,(_Link_type)ppuVar9);
      __p = p_Var10;
    }
    p_Var5 = (_Base_ptr)operator_new(0x10);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformAction_00a370f0;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    p_Var6[1]._M_color = 2;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    *(undefined4 *)&p_Var6[1]._M_right = 0x4f4c4f54;
    *(undefined4 *)((long)&p_Var6[1]._M_right + 3) = 0x5245574f;
    *(undefined1 *)((long)&p_Var6[1]._M_right + 7) = 0;
    p_Var6[1]._M_left = (_Base_ptr)0x7;
    p_Var6[2]._M_parent = (_Base_ptr)0x0;
    p_Var6[2]._M_left = p_Var5;
    pVar12 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)__p);
    p_Var10 = (_Link_type)pVar12.second;
    if (p_Var10 == (_Link_type)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,__p);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar12.first,(_Base_ptr)p_Var10,p_Var6,(_Link_type)ppuVar9);
      __p = p_Var10;
    }
    p_Var5 = (_Base_ptr)operator_new(0x10);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformAction_00a37148;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    p_Var6[1]._M_color = 4;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    *(undefined4 *)&p_Var6[1]._M_right = 0x49525453;
    *(undefined2 *)((long)&p_Var6[1]._M_right + 4) = 0x50;
    p_Var6[1]._M_left = (_Base_ptr)&DAT_00000005;
    p_Var6[2]._M_parent = (_Base_ptr)0x0;
    p_Var6[2]._M_left = p_Var5;
    pVar12 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)__p);
    p_Var10 = (_Link_type)pVar12.second;
    if (p_Var10 == (_Link_type)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,__p);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar12.first,(_Base_ptr)p_Var10,p_Var6,(_Link_type)ppuVar9);
      __p = p_Var10;
    }
    p_Var5 = (_Base_ptr)operator_new(0x10);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformAction_00a371a0;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    p_Var6[1]._M_color = 5;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    p_Var6[1]._M_right = (_Base_ptr)0x54535f58454e4547;
    *(undefined4 *)((long)&p_Var6[1]._M_right + 7) = 0x50495254;
    *(byte *)((long)&p_Var6[2]._M_color + 3) = 0;
    p_Var6[1]._M_left = (_Base_ptr)0xb;
    p_Var6[2]._M_parent = (_Base_ptr)0x0;
    p_Var6[2]._M_left = p_Var5;
    pVar12 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)__p);
    p_Var10 = (_Link_type)pVar12.second;
    if (p_Var10 == (_Link_type)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,__p);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar12.first,(_Base_ptr)p_Var10,p_Var6,(_Link_type)ppuVar9);
      __p = p_Var10;
    }
    p_Var5 = (_Base_ptr)operator_new(0x18);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformActionReplace_00a371f8;
    p_Var5->_M_left = (_Base_ptr)0x0;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    p_Var6[1]._M_color = 6;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    *(undefined4 *)&p_Var6[1]._M_right = 0x4c504552;
    *(undefined4 *)((long)&p_Var6[1]._M_right + 3) = 0x4543414c;
    *(undefined1 *)((long)&p_Var6[1]._M_right + 7) = 0;
    p_Var6[1]._M_left = (_Base_ptr)0x7;
    p_Var6[2]._M_parent = (_Base_ptr)0x2;
    p_Var6[2]._M_left = p_Var5;
    pVar12 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)__p);
    if (pVar12.second == (_Base_ptr)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,__p);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar12.first,pVar12.second,p_Var6,(_Link_type)ppuVar9);
    }
  }
  puVar1 = (undefined1 *)((long)&local_78.field_2 + 8);
  local_78.field_2._M_allocated_capacity = 0;
  local_78.field_2._M_local_buf[8] = '\0';
  local_50 = 0;
  plStack_48 = (long *)0x0;
  local_9c = action;
  local_78._M_dataplus._M_p._0_4_ = action;
  local_78._M_string_length = (size_type)puVar1;
  local_40 = (_Base_ptr)arity;
  local_38 = selector;
  if ((anonymous_namespace)::Descriptors._40_8_ == 0) {
    p_Var6 = (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20);
  }
  else {
    p_Var11 = (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20);
    p_Var5 = (_Base_ptr)(anonymous_namespace)::Descriptors._40_8_;
    do {
      local_98._M_dataplus._M_p._0_4_ = p_Var5[1]._M_color;
      local_a0 = (_Rb_tree_color)local_78._M_dataplus._M_p;
      if ((anonymous_namespace)::Descriptors._16_8_ == 0) goto LAB_001b461e;
      bVar3 = (*(code *)(anonymous_namespace)::Descriptors._24_8_)
                        ((anonymous_namespace)::Descriptors,&local_98,&local_a0);
      if (bVar3 == 0) {
        p_Var11 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[bVar3];
    } while (p_Var5 != (_Base_ptr)0x0);
    p_Var6 = (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20);
    if (p_Var11 != (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20)) {
      local_a0 = p_Var11[1]._M_color;
      local_98._M_dataplus._M_p._0_4_ = (_Rb_tree_color)local_78._M_dataplus._M_p;
      if ((anonymous_namespace)::Descriptors._16_8_ == 0) {
LAB_001b461e:
        std::__throw_bad_function_call();
      }
      cVar4 = (*(code *)(anonymous_namespace)::Descriptors._24_8_)
                        ((anonymous_namespace)::Descriptors,&local_98,&local_a0);
      p_Var6 = p_Var11;
      if (cVar4 != '\0') {
        p_Var6 = (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20);
      }
    }
  }
  if (plStack_48 != (long *)0x0) {
    (**(code **)(*plStack_48 + 8))();
  }
  plStack_48 = (long *)0x0;
  if ((undefined1 *)local_78._M_string_length != puVar1) {
    operator_delete((void *)local_78._M_string_length,
                    CONCAT71(local_78.field_2._9_7_,local_78.field_2._M_local_buf[8]) + 1);
  }
  puVar2 = local_38;
  if (p_Var6 == (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20)) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_98,local_9c);
    cmStrCat<char_const(&)[25],std::__cxx11::string,char_const(&)[17]>
              (&local_78,(char (*) [25])" sub-command TRANSFORM, ",&local_98,
               (char (*) [17])" invalid action.");
    std::runtime_error::runtime_error(prVar8,(string *)&local_78);
    *(undefined ***)prVar8 = &PTR__runtime_error_00a374b0;
    __cxa_throw(prVar8,&cmList::transform_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (p_Var6[2]._M_parent != local_40) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    cmStrCat<char_const(&)[31],std::__cxx11::string_const&,char_const(&)[10],unsigned_long_const&,char_const(&)[14]>
              (&local_78,(char (*) [31])"sub-command TRANSFORM, action ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &p_Var6[1]._M_parent,(char (*) [10])" expects ",(unsigned_long *)&p_Var6[2]._M_parent
               ,(char (*) [14])0x7f2cce);
    std::runtime_error::runtime_error(prVar8,(string *)&local_78);
    *(undefined ***)prVar8 = &PTR__runtime_error_00a374b0;
    __cxa_throw(prVar8,&cmList::transform_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_38->_M_t).
      super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
      .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl ==
      (TransformSelector *)0x0) {
    pTVar7 = (TransformSelector *)operator_new(0x28);
    pTVar7[1]._vptr_TransformSelector = (_func_int **)(pTVar7 + 3);
    pTVar7[3]._vptr_TransformSelector = (_func_int **)0x43454c4553204f4e;
    *(undefined4 *)((long)&pTVar7[3]._vptr_TransformSelector + 7) = 0x524f5443;
    *(undefined1 *)((long)&pTVar7[4]._vptr_TransformSelector + 3) = 0;
    pTVar7[2]._vptr_TransformSelector = (_func_int **)0xb;
    pTVar7->_vptr_TransformSelector = (_func_int **)&PTR__TransformSelector_00a37250;
    (puVar2->_M_t).
    super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
    .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl = pTVar7;
  }
  return (iterator)p_Var6;
}

Assistant:

ActionDescriptorSet::iterator TransformConfigure(
  cmList::TransformAction action,
  std::unique_ptr<cmList::TransformSelector>& selector, std::size_t arity)
{
  if (Descriptors.empty()) {
    Descriptors.emplace(cmList::TransformAction::APPEND, "APPEND", 1,
                        cm::make_unique<TransformActionAppend>());
    Descriptors.emplace(cmList::TransformAction::PREPEND, "PREPEND", 1,
                        cm::make_unique<TransformActionPrepend>());
    Descriptors.emplace(cmList::TransformAction::TOUPPER, "TOUPPER", 0,
                        cm::make_unique<TransformActionToUpper>());
    Descriptors.emplace(cmList::TransformAction::TOLOWER, "TOLOWER", 0,
                        cm::make_unique<TransformActionToLower>());
    Descriptors.emplace(cmList::TransformAction::STRIP, "STRIP", 0,
                        cm::make_unique<TransformActionStrip>());
    Descriptors.emplace(cmList::TransformAction::GENEX_STRIP, "GENEX_STRIP", 0,
                        cm::make_unique<TransformActionGenexStrip>());
    Descriptors.emplace(cmList::TransformAction::REPLACE, "REPLACE", 2,
                        cm::make_unique<TransformActionReplace>());
  }

  auto descriptor = Descriptors.find(action);
  if (descriptor == Descriptors.end()) {
    throw transform_error(cmStrCat(" sub-command TRANSFORM, ",
                                   std::to_string(static_cast<int>(action)),
                                   " invalid action."));
  }

  if (descriptor->Arity != arity) {
    throw transform_error(cmStrCat("sub-command TRANSFORM, action ",
                                   descriptor->Name, " expects ",
                                   descriptor->Arity, " argument(s)."));
  }
  if (!selector) {
    selector = cm::make_unique<TransformNoSelector>();
  }

  return descriptor;
}